

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall
Minisat::Solver::toDimacs(Solver *this,FILE *f,Clause *c,vec<int,_int> *map,Var_conflict *max)

{
  byte bVar1;
  Clause CVar2;
  bool bVar3;
  anon_struct_4_5_613047fb_for_header aVar4;
  Var_conflict VVar5;
  byte bVar6;
  char *pcVar7;
  ulong uVar8;
  
  bVar3 = satisfied(this,c);
  if (bVar3) {
    return;
  }
  aVar4 = c->header;
  if (0x1f < (uint)aVar4) {
    uVar8 = 0;
    bVar6 = l_False;
    do {
      CVar2.header = c[uVar8 + 1].header;
      bVar1 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.
              data[(int)CVar2.header >> 1].value;
      if (((CVar2.header._0_1_ & 1 ^ bVar1) != bVar6 || (bVar6 & 2) != 0) &&
          (bVar1 & bVar6 & 2) == 0) {
        pcVar7 = "-";
        if (((uint)CVar2.header & 1) == 0) {
          pcVar7 = "";
        }
        VVar5 = mapVar((int)CVar2.header >> 1,map,max);
        fprintf((FILE *)f,"%s%d ",pcVar7,(ulong)(VVar5 + 1));
        aVar4 = c->header;
        bVar6 = l_False;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (uint)aVar4 >> 5);
  }
  fwrite("0\n",2,1,(FILE *)f);
  return;
}

Assistant:

void Solver::toDimacs(FILE* f, Clause& c, vec<Var>& map, Var& max)
{
    if (satisfied(c)) return;

    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) != l_False)
            fprintf(f, "%s%d ", sign(c[i]) ? "-" : "", mapVar(var(c[i]), map, max)+1);
    fprintf(f, "0\n");
}